

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int KINGetNumLinConvFails(void *kinmem,long *nlcfails)

{
  undefined8 *in_RSI;
  int retval;
  KINLsMem kinls_mem;
  KINMem kin_mem;
  KINMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = kinLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(KINLsMem *)0x115ef9);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x60);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int KINGetNumLinConvFails(void* kinmem, long int* nlcfails)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure; set output value and return */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }
  *nlcfails = kinls_mem->ncfl;
  return (KINLS_SUCCESS);
}